

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall OpenMD::SelectionEvaluator::evaluate(SelectionEvaluator *this)

{
  SelectionEvaluator *in_RSI;
  SelectionSet *in_RDI;
  SelectionSet bs;
  SelectionEvaluator *in_stack_ffffffffffffffe8;
  SelectionEvaluator *this_00;
  SelectionSet *this_01;
  
  this_00 = in_RSI;
  this_01 = in_RDI;
  createSelectionSets(in_stack_ffffffffffffffe8);
  if ((in_RSI->isLoaded_ & 1U) != 0) {
    in_RSI->pc = 0;
    instructionDispatchLoop(this_00,(SelectionSet *)in_stack_ffffffffffffffe8);
  }
  SelectionSet::parallelReduce(this_01);
  SelectionSet::~SelectionSet((SelectionSet *)0x3c5c6f);
  return in_RDI;
}

Assistant:

SelectionSet SelectionEvaluator::evaluate() {
    SelectionSet bs = createSelectionSets();
    if (isLoaded_) {
      pc = 0;
      instructionDispatchLoop(bs);
    }
    return bs.parallelReduce();
  }